

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

bool __thiscall
Lib::
DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
::set(DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
      *this,pair<unsigned_int,_unsigned_int> key,TermList val)

{
  Entry *pEVar1;
  pair<unsigned_int,_unsigned_int> *in_RDX;
  pair<unsigned_int,_unsigned_int> in_RSI;
  DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_RDI;
  bool bVar2;
  bool exists;
  Entry *e;
  
  ensureExpanded(in_RDI);
  pEVar1 = findEntryToInsert((DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                              *)in_RSI,in_RDX);
  bVar2 = false;
  if ((uint)(pEVar1->field_0)._infoData >> 2 == in_RDI->_timestamp) {
    bVar2 = ((pEVar1->field_0)._infoData & 1U) == 0;
  }
  if (!bVar2) {
    if ((uint)(pEVar1->field_0)._infoData >> 2 == in_RDI->_timestamp) {
      in_RDI->_deleted = in_RDI->_deleted + -1;
    }
    else {
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 3U | in_RDI->_timestamp << 2;
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffd;
    }
    (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffe;
    std::pair<unsigned_int,_unsigned_int>::operator=(&pEVar1->_key,(type)&stack0xfffffffffffffff8);
    in_RDI->_size = in_RDI->_size + 1;
  }
  (pEVar1->_val)._content = (uint64_t)in_RDX;
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool set(Key key, Val val)
  {
    ensureExpanded();
    Entry* e = findEntryToInsert(std::move(key));
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key=key;
      _size++;
    }
    e->_val = std::move(val);
    return !exists;
  }